

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int unixFileSize(unqlite_file *id,sxi64 *pSize)

{
  int *piVar1;
  undefined1 local_b8 [8];
  stat buf;
  int rc;
  sxi64 *pSize_local;
  unqlite_file *id_local;
  
  buf.__glibc_reserved[2]._4_4_ = fstat(*(int *)&id[2].pMethods,(stat *)local_b8);
  if (buf.__glibc_reserved[2]._4_4_ == 0) {
    *pSize = buf.st_rdev;
    if (*pSize == 1) {
      *pSize = 0;
    }
    id_local._4_4_ = 0;
  }
  else {
    piVar1 = __errno_location();
    *(int *)((long)&id[3].pMethods + 4) = *piVar1;
    id_local._4_4_ = -2;
  }
  return id_local._4_4_;
}

Assistant:

static int unixFileSize(unqlite_file *id,sxi64 *pSize){
  int rc;
  struct stat buf;
  
  rc = fstat(((unixFile*)id)->h, &buf);
  
  if( rc!=0 ){
    ((unixFile*)id)->lastErrno = errno;
    return UNQLITE_IOERR;
  }
  *pSize = buf.st_size;

  /* When opening a zero-size database, the findInodeInfo() procedure
  ** writes a single byte into that file in order to work around a bug
  ** in the OS-X msdos filesystem.  In order to avoid problems with upper
  ** layers, we need to report this file size as zero even though it is
  ** really 1.   Ticket #3260.
  */
  if( *pSize==1 ) *pSize = 0;

  return UNQLITE_OK;
}